

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix3d>
          (GeomPrimvar *this,matrix3d *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  void *__dest;
  uint32_t uVar3;
  matrix3d *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  string local_118;
  undefined1 local_f4 [4];
  string local_f0 [2];
  string local_a0;
  undefined1 local_80 [80];
  
  bVar8 = 0;
  if (dest == (matrix3d *)0x0) {
joined_r0x001ae39e:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar6 = false;
      }
      else {
        uVar3 = (*pvVar1->type_id)();
        bVar6 = uVar3 == 4;
      }
      if ((bVar6) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x001ae39e;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar7 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar6 = !bVar7;
        if (bVar7) {
          if (err == (string *)0x0) {
            return bVar6;
          }
          std::__cxx11::string::append((char *)err);
          return bVar6;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        pmVar4 = tinyusdz::value::Value::as<tinyusdz::value::matrix3d>(&pSVar2->value,false);
        if (pmVar4 != (matrix3d *)0x0) {
          for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
            dest->m[0][0] = pmVar4->m[0][0];
            pmVar4 = (matrix3d *)((long)pmVar4 + ((ulong)bVar8 * -2 + 1) * 8);
            dest = (matrix3d *)((long)dest + ((ulong)bVar8 * -2 + 1) * 8);
          }
          return bVar6;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar3 = Attribute::type_id(this_00);
      bVar6 = IsSupportedGeomPrimvarType(uVar3);
      if (bVar6) {
        primvar::PrimVar::get_value<tinyusdz::value::matrix3d>
                  ((optional<tinyusdz::value::matrix3d> *)local_80,&(this->_attr)._var);
        if (local_80[0] == true) {
          __dest = (void *)((long)&local_f0[0]._M_dataplus._M_p + 7);
          memcpy(__dest,local_80 + 8,0x48);
          memcpy(local_80 + 7,__dest,0x48);
        }
        if (local_80[0] != false) {
          memcpy(dest,local_80 + 7,0x48);
          return local_80[0];
        }
        if (err == (string *)0x0) {
          return false;
        }
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_f4 = (undefined1  [4])0x37;
        Attribute::type_name_abi_cxx11_(&local_a0,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)(local_f4 + 4),(fmt *)&local_118,(string *)local_f4,(uint *)&local_a0,
                   in_R8);
        std::__cxx11::string::_M_append((char *)err,(ulong)local_f0[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          operator_delete(local_f0[0]._M_dataplus._M_p,local_f0[0].field_2._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == &local_118.field_2) {
          return false;
        }
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        return false;
      }
      if (err != (string *)0x0) {
        local_f0[0]._M_dataplus._M_p = (pointer)&local_f0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_f4 + 4),"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_(&local_118,this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_80,(fmt *)(local_f4 + 4),&local_118,in_RCX);
        std::__cxx11::string::_M_append((char *)err,CONCAT71(local_80._1_7_,local_80[0]));
        if ((undefined1 *)CONCAT71(local_80._1_7_,local_80[0]) != local_80 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_80._1_7_,local_80[0]),local_80._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0[0]._M_dataplus._M_p != &local_f0[0].field_2) {
          operator_delete(local_f0[0]._M_dataplus._M_p,local_f0[0].field_2._0_8_ + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}